

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

size_t strcspn(char *__s,char *__reject)

{
  char *pcVar1;
  size_t res;
  size_t sVar2;
  
  sVar2 = 0;
  while( true ) {
    if (__s[sVar2] == '\0') {
      return sVar2;
    }
    pcVar1 = strchr(__reject,(int)__s[sVar2]);
    if (pcVar1 != (char *)0x0) break;
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

size_t strcspn(const char *s1, const char *s2) {
    size_t res = 0;
    while (*s1 != '\0') {
        if (strchr(s2, *s1) == NULL) {
            ++s1;
            ++res;
        } else {
            return res;
        }
    }
    return res;
}